

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O3

string * __thiscall Record::Finds_abi_cxx11_(string *__return_storage_ptr__,Record *this,int c)

{
  pointer pKVar1;
  pointer pcVar2;
  size_type *psVar3;
  long lVar4;
  
  pKVar1 = (this->KS).super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->KS).super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pKVar1;
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 3) * -0x3333333333333333;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    psVar3 = &(pKVar1->Value)._M_string_length;
    do {
      if ((int)psVar3[-2] == c) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (((string *)(psVar3 + -1))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,pcVar2 + *psVar3);
        return __return_storage_ptr__;
      }
      psVar3 = psVar3 + 5;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cannot Find this Column!",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string Record::Finds(int c) {
	int i;
	for (i = 0; i < KS.size(); i++) {
		if (KS[i].Column == c)break;
	}
	if (i < KS.size())
		return KS[i].Value;
	else {
		cout << "Cannot Find this Column!" << endl;
		return "";
	}
}